

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3InsertTerms(Fts3Table *p,int iLangid,sqlite3_value **apVal,u32 *aSz)

{
  int iVar1;
  uchar *zText_00;
  int rc;
  char *zText;
  int iCol;
  int i;
  u32 *aSz_local;
  sqlite3_value **apVal_local;
  int iLangid_local;
  Fts3Table *p_local;
  
  zText._4_4_ = 2;
  do {
    if (p->nColumn + 2 <= zText._4_4_) {
      return 0;
    }
    iVar1 = zText._4_4_ + -2;
    if (p->abNotindexed[iVar1] == '\0') {
      zText_00 = sqlite3_value_text(apVal[zText._4_4_]);
      iVar1 = fts3PendingTermsAdd(p,iLangid,(char *)zText_00,iVar1,aSz + iVar1);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = sqlite3_value_bytes(apVal[zText._4_4_]);
      aSz[p->nColumn] = iVar1 + aSz[p->nColumn];
    }
    zText._4_4_ = zText._4_4_ + 1;
  } while( true );
}

Assistant:

static int fts3InsertTerms(
  Fts3Table *p, 
  int iLangid, 
  sqlite3_value **apVal, 
  u32 *aSz
){
  int i;                          /* Iterator variable */
  for(i=2; i<p->nColumn+2; i++){
    int iCol = i-2;
    if( p->abNotindexed[iCol]==0 ){
      const char *zText = (const char *)sqlite3_value_text(apVal[i]);
      int rc = fts3PendingTermsAdd(p, iLangid, zText, iCol, &aSz[iCol]);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      aSz[p->nColumn] += sqlite3_value_bytes(apVal[i]);
    }
  }
  return SQLITE_OK;
}